

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O3

ALLEGRO_PATH * al_clone_path(ALLEGRO_PATH *path)

{
  ALLEGRO_PATH *pAVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ALLEGRO_USTR *pAVar4;
  ulong uVar5;
  uint uVar6;
  
  pAVar1 = al_create_path((char *)0x0);
  if (pAVar1 != (ALLEGRO_PATH *)0x0) {
    al_ustr_assign(pAVar1->drive,path->drive);
    al_ustr_assign(pAVar1->filename,path->filename);
    if ((path->segments)._size != 0) {
      uVar6 = 1;
      do {
        puVar2 = (undefined8 *)_al_vector_alloc_back(&pAVar1->segments);
        puVar3 = (undefined8 *)_al_vector_ref(&path->segments,uVar6 - 1);
        pAVar4 = al_ustr_dup((ALLEGRO_USTR *)*puVar3);
        *puVar2 = pAVar4;
        uVar5 = (ulong)uVar6;
        uVar6 = uVar6 + 1;
      } while (uVar5 < (path->segments)._size);
    }
  }
  return pAVar1;
}

Assistant:

ALLEGRO_PATH *al_clone_path(const ALLEGRO_PATH *path)
{
   ALLEGRO_PATH *clone;
   unsigned int i;

   ASSERT(path);

   clone = al_create_path(NULL);
   if (!clone) {
      return NULL;
   }

   al_ustr_assign(clone->drive, path->drive);
   al_ustr_assign(clone->filename, path->filename);

   for (i = 0; i < _al_vector_size(&path->segments); i++) {
      ALLEGRO_USTR **slot = _al_vector_alloc_back(&clone->segments);
      (*slot) = al_ustr_dup(get_segment(path, i));
   }

   return clone;
}